

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

apx_error_t run_array_next(apx_vm_t *self)

{
  _Bool _Var1;
  int local_20;
  _Bool local_19;
  apx_error_t result;
  _Bool is_last_index;
  apx_vm_t *self_local;
  
  local_19 = false;
  _result = self;
  _Var1 = is_pack_prog(self);
  if (_Var1) {
    local_20 = apx_vm_serializer_array_next(&_result->serializer,&local_19);
  }
  else {
    local_20 = apx_vm_deserializer_array_next(&_result->deserializer,&local_19);
  }
  if (local_20 == 0) {
    if ((local_19 & 1U) == 0) {
      _Var1 = apx_vm_decoder_has_saved_program_position(&_result->decoder);
      if (!_Var1) {
        return 0x30;
      }
      apx_vm_decoder_recall_program_position(&_result->decoder);
    }
    self_local._4_4_ = 0;
  }
  else {
    self_local._4_4_ = local_20;
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t run_array_next(apx_vm_t* self)
{
   bool is_last_index = false;
   apx_error_t result = APX_NO_ERROR;
   if (is_pack_prog(self))
   {
      result = apx_vm_serializer_array_next(&self->serializer, &is_last_index);
   }
   else
   {
      result = apx_vm_deserializer_array_next(&self->deserializer, &is_last_index);
   }
   if (result != APX_NO_ERROR)
   {
      return result;
   }
   if (!is_last_index)
   {
      if (apx_vm_decoder_has_saved_program_position(&self->decoder))
      {
         apx_vm_decoder_recall_program_position(&self->decoder);
      }
      else
      {
         return APX_INVALID_INSTRUCTION_ERROR;
      }
   }
   return APX_NO_ERROR;
}